

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BuildAndStoreBlockSwitchEntropyCodes
               (BlockEncoder *self,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *depth;
  uint16_t *bits;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  byte *pbVar5;
  uint *puVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint32_t local_4a8 [28];
  uint32_t type_histo [258];
  
  uVar9 = self->num_block_types_;
  pbVar5 = self->block_types_;
  puVar6 = self->block_lengths_;
  sVar7 = self->num_blocks_;
  memset(type_histo,0,uVar9 * 4 + 8);
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[0xe] = 0;
  local_4a8[0xf] = 0;
  local_4a8[0x10] = 0;
  local_4a8[0x11] = 0;
  local_4a8[0x12] = 0;
  local_4a8[0x13] = 0;
  local_4a8[0x14] = 0;
  local_4a8[0x15] = 0;
  local_4a8[0x16] = 0;
  local_4a8[0x17] = 0;
  local_4a8[0x18] = 0;
  local_4a8[0x19] = 0;
  if (sVar7 != 0) {
    sVar12 = 0;
    uVar10 = 1;
    uVar11 = 0;
    do {
      uVar8 = uVar10;
      bVar1 = pbVar5[sVar12];
      uVar10 = (ulong)bVar1;
      if (sVar12 != 0) {
        uVar15 = (ulong)(bVar1 + 2);
        if (uVar11 == uVar10) {
          uVar15 = 0;
        }
        if (uVar8 + 1 == uVar10) {
          uVar15 = 1;
        }
        type_histo[uVar15] = type_histo[uVar15] + 1;
      }
      uVar2 = puVar6[sVar12];
      lVar14 = 0xe;
      if (0x2f0 < uVar2) {
        lVar14 = 0x14;
      }
      lVar13 = 0;
      if (0x28 < uVar2) {
        lVar13 = 7;
      }
      if (0xb0 < uVar2) {
        lVar13 = lVar14;
      }
      uVar11 = lVar13 - 1;
      do {
        if (uVar11 == 0x18) {
          uVar15 = 0x19;
          break;
        }
        uVar15 = uVar11 + 1;
        lVar14 = uVar11 + 2;
        uVar11 = uVar15;
      } while (kBlockLengthPrefixCode[lVar14].offset <= uVar2);
      local_4a8[uVar15 & 0xffffffff] = local_4a8[uVar15 & 0xffffffff] + 1;
      sVar12 = sVar12 + 1;
      uVar11 = uVar8;
    } while (sVar12 != sVar7);
  }
  StoreVarLenUint8(uVar9 - 1,storage_ix,storage);
  if (1 < uVar9) {
    BuildAndStoreHuffmanTree
              (type_histo,uVar9 + 2,uVar9 + 2,tree,(self->block_split_code_).type_depths,
               (self->block_split_code_).type_bits,storage_ix,storage);
    depth = (self->block_split_code_).length_depths;
    bits = (self->block_split_code_).length_bits;
    BuildAndStoreHuffmanTree(local_4a8,0x1a,0x1a,tree,depth,bits,storage_ix,storage);
    uVar2 = *puVar6;
    bVar1 = *pbVar5;
    (self->block_split_code_).type_code_calculator.second_last_type =
         (self->block_split_code_).type_code_calculator.last_type;
    (self->block_split_code_).type_code_calculator.last_type = (ulong)bVar1;
    lVar14 = 0xe;
    if (0x2f0 < uVar2) {
      lVar14 = 0x14;
    }
    lVar13 = 7;
    if (uVar2 < 0x29) {
      lVar13 = 0;
    }
    if (0xb0 < uVar2) {
      lVar13 = lVar14;
    }
    uVar9 = lVar13 - 1;
    do {
      if (uVar9 == 0x18) {
        uVar10 = 0x19;
        break;
      }
      uVar10 = uVar9 + 1;
      lVar14 = uVar9 + 2;
      uVar9 = uVar10;
    } while (kBlockLengthPrefixCode[lVar14].offset <= uVar2);
    uVar10 = uVar10 & 0xffffffff;
    uVar3 = kBlockLengthPrefixCode[uVar10].nbits;
    uVar4 = kBlockLengthPrefixCode[uVar10].offset;
    uVar9 = *storage_ix;
    uVar11 = depth[uVar10] + uVar9;
    *(ulong *)(storage + (uVar9 >> 3)) =
         (ulong)bits[uVar10] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
    *storage_ix = uVar11;
    *(ulong *)(storage + (uVar11 >> 3)) =
         (ulong)(uVar2 - uVar4) << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
    *storage_ix = uVar11 + uVar3;
  }
  return;
}

Assistant:

static void BuildAndStoreBlockSwitchEntropyCodes(BlockEncoder* self,
    HuffmanTree* tree, size_t* storage_ix, uint8_t* storage) {
  BuildAndStoreBlockSplitCode(self->block_types_, self->block_lengths_,
      self->num_blocks_, self->num_block_types_, tree, &self->block_split_code_,
      storage_ix, storage);
}